

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aniconverter.h
# Opt level: O2

int ani::extract_ani_frames(path *p,path *out_p)

{
  ulong uVar1;
  ostream *poVar2;
  int iVar3;
  pointer __x;
  char *pcVar4;
  int i;
  long lVar5;
  finfo f_info;
  undefined4 uStack_484;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  frames;
  ani_header header;
  ifstream aniFile;
  ofstream outfile;
  
  header.framerate = 0;
  header.frame_buff_sz = 0;
  header.unknown_1 = 0;
  header.signature = 0;
  header.frames_count = 0;
  header.file_size = 0;
  header.unknown_0 = 0;
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)&aniFile,p,_S_bin|_S_ate);
  uVar1 = std::istream::tellg();
  if (uVar1 < 0x20) {
    pcVar4 = "ANI file too short";
  }
  else {
    std::istream::seekg(&aniFile,0,0);
    std::istream::read((char *)&aniFile,(long)&header);
    if (header.signature == 0x8f2a6ec9) {
      print_ani_header(&header);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector(&frames,(ulong)header._0_8_ >> 0x20,(allocator_type *)&outfile);
      std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                ((ofstream *)&outfile,out_p,_S_bin);
      lVar5 = 0;
      for (uVar1 = 0; uVar1 < (ulong)header._0_8_ >> 0x20; uVar1 = uVar1 + 1) {
        f_info = (finfo)0x0;
        std::istream::read((char *)&aniFile,(long)&f_info);
        poVar2 = std::operator<<((ostream *)&std::cout,"Frame ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar1);
        poVar2 = std::operator<<(poVar2," sz: ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        pcVar4 = " (start frame)";
        if (-1 < (int)f_info) {
          pcVar4 = "";
        }
        poVar2 = std::operator<<(poVar2,pcVar4);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&((frames.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar5),
                   (ulong)((uint)f_info & 0x7fffffff));
        std::istream::read((char *)&aniFile,
                           *(long *)((long)&((frames.
                                              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar5));
        lVar5 = lVar5 + 0x18;
      }
      for (__x = frames.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          __x != frames.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&f_info,__x);
        std::ostream::write((char *)&outfile,CONCAT44(uStack_484,f_info));
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&f_info);
      }
      std::ofstream::~ofstream(&outfile);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&frames);
      iVar3 = 0;
      goto LAB_00107b8c;
    }
    pcVar4 = "ANI signature mismatch";
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar3 = -1;
LAB_00107b8c:
  std::ifstream::~ifstream(&aniFile);
  return iVar3;
}

Assistant:

inline int extract_ani_frames(const fs::path &p, const fs::path &out_p) {

        ani_header header{};

        ifstream aniFile(p, ios::binary | ios::ate);
        auto fileSize = aniFile.tellg();
        if (fileSize < sizeof(ani_header)) {
            std::cerr << "ANI file too short" << std::endl;
            return -1;
        }

        aniFile.seekg(0);
        aniFile.read(reinterpret_cast<char *>(&header), sizeof(ani_header));
        if (header.signature != ANI_MAGIC) {
            std::cerr << "ANI signature mismatch" << std::endl;
            return -1;
        }

        print_ani_header(header);

        vector<vector<uint8_t>> frames(header.frames_count);

        ofstream outfile(out_p, ios::binary);

        for (auto i = 0; i < header.frames_count; ++i) {
            finfo f_info{};
            aniFile.read(reinterpret_cast<char *>(&f_info), sizeof(finfo));

            std::cout << "Frame " << i << " sz: " << f_info.length
                      << (f_info.start_frame? " (start frame)" : "") << std::endl;

            frames[i].resize(f_info.length);
            aniFile.read(reinterpret_cast<char *>(frames[i].data()), f_info.length);
        }

        for (auto f : frames) {
            outfile.write(reinterpret_cast<char *>(f.data()), (long) f.size());
        }

        return 0;
    }